

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastunpack24_8(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in & 0xffffff;
  puVar1 = out + 1;
  *puVar1 = *in >> 0x18;
  *puVar1 = (in[1] & 0xffff) << 8 | *puVar1;
  puVar1 = out + 2;
  *puVar1 = in[1] >> 0x10;
  *puVar1 = (in[2] & 0xff) << 0x10 | *puVar1;
  out[3] = in[2] >> 8;
  out[4] = in[3] & 0xffffff;
  puVar1 = out + 5;
  *puVar1 = in[3] >> 0x18;
  *puVar1 = (in[4] & 0xffff) << 8 | *puVar1;
  puVar1 = out + 6;
  *puVar1 = in[4] >> 0x10;
  *puVar1 = (in[5] & 0xff) << 0x10 | *puVar1;
  out[7] = in[5] >> 8;
  return in + 6;
}

Assistant:

const uint32_t *__fastunpack24_8(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 24);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 16)) << (24 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 8)) << (24 - 8);
  out++;
  *out = ((*in) >> 8);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 24);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 16)) << (24 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 8)) << (24 - 8);
  out++;
  *out = ((*in) >> 8);
  ++in;
  out++;

  return in;
}